

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base32Encoding.cpp
# Opt level: O0

size_t axl::enc::Base32Encoding::decode
                 (Array<char,_axl::sl::ArrayDetails<char>_> *buffer,StringRef *string)

{
  char cVar1;
  ulong uVar2;
  C *pCVar3;
  size_t sVar4;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  size_t unaff_retaddr;
  uchar_t y;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_00000008;
  char c;
  char *end;
  char *p;
  size_t i;
  uint_t x;
  size_t sizeGuess;
  ValueArg in_stack_ffffffffffffffbf;
  undefined6 in_stack_ffffffffffffffc0;
  char *local_30;
  ulong local_28;
  
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength(in_RSI);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve(in_stack_00000008,unaff_retaddr);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x186fbe);
  local_28 = 0;
  local_30 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cp(in_RSI);
  pCVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getEnd(in_RSI);
  for (; local_30 < pCVar3; local_30 = local_30 + 1) {
    cVar1 = *local_30;
    uVar2 = local_28;
    if (((('1' < cVar1) && (cVar1 < '[')) && (decode::charMap[cVar1 + -0x32] < 0x20)) &&
       (uVar2 = local_28 + 5, 7 < local_28 + 5)) {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)
                 CONCAT17(cVar1,CONCAT16(decode::charMap[cVar1 + -0x32],in_stack_ffffffffffffffc0)),
                 in_stack_ffffffffffffffbf,0x18709f);
      uVar2 = local_28 - 3;
    }
    local_28 = uVar2;
  }
  sVar4 = sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  return sVar4;
}

Assistant:

size_t
Base32Encoding::decode(
	sl::Array<char>* buffer,
	const sl::StringRef& string
) {
	static const uchar_t charMap['Z' - '2' + 1] = {
		26, 27, 28, 29, 30, 31,                             //  2 .. 7
		-1, -1, -1, -1, -1, -1, -1, -1, -1,                 //  8  9  :  ;  <  =  >  ?  @
		 0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, //  A .. M
		13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, //  N .. Z
	};

	size_t sizeGuess = (string.getLength() * 5) / 8;
	buffer->reserve(sizeGuess);
	buffer->clear();

	uint_t x = 0;
	size_t i = 0;

	const char* p = string.cp();
	const char* end = string.getEnd();
	for (; p < end; p++) {
		char c = *p;
		if (c < '2' || c > 'Z')
			continue; // ignore padding & whitespace

		uchar_t y = charMap[c - '2'];
		if (y > 31)
			continue; // ignore padding & non-Base32 chars

		x <<= 5;
		x |= y;
		i += 5;

		if (i >= 8) {
			i -= 8;
			buffer->append(x >> i);
		}
	}

	return buffer->getCount();
}